

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scspdsp.c
# Opt level: O0

void SCSPDSP_Start(SCSPDSP *DSP)

{
  UINT16 *pUVar1;
  UINT16 *IPtr;
  int i;
  SCSPDSP *DSP_local;
  
  DSP->Stopped = 0;
  IPtr._4_4_ = 0x7f;
  while ((((-1 < IPtr._4_4_ && (pUVar1 = DSP->MPRO + (IPtr._4_4_ << 2), *pUVar1 == 0)) &&
          (pUVar1[1] == 0)) && ((pUVar1[2] == 0 && (pUVar1[3] == 0))))) {
    IPtr._4_4_ = IPtr._4_4_ + -1;
  }
  DSP->LastStep = IPtr._4_4_ + 1;
  return;
}

Assistant:

void SCSPDSP_Start(SCSPDSP *DSP)
{
	int i;
	DSP->Stopped=0;
	for(i=127;i>=0;--i)
	{
		UINT16 *IPtr=DSP->MPRO+i*4;

		if(IPtr[0]!=0 || IPtr[1]!=0 || IPtr[2]!=0 || IPtr[3]!=0)
			break;
	}
	DSP->LastStep=i+1;

}